

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::GetToken(Parser *this)

{
  bool bVar1;
  Token *this_00;
  Token temp;
  
  Lexer::Get(&temp,&this->lexer);
  bVar1 = std::operator!=(&temp.type,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (anonymous_namespace)::WHITESPACE_abi_cxx11_);
  if (bVar1) {
    bVar1 = std::operator!=(&temp.type,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (anonymous_namespace)::COMMENT_abi_cxx11_);
    if (bVar1) {
      this_00 = (Token *)operator_new(0x48);
      Token::Token(this_00,&temp);
      this->token = this_00;
      goto LAB_0011111a;
    }
  }
  GetToken(this);
LAB_0011111a:
  Token::~Token(&temp);
  return;
}

Assistant:

void Parser::GetToken()
{
	Token temp = lexer.Get();

	if (temp.type != WHITESPACE && temp.type != COMMENT)
		token = new Token(temp);
	else
		GetToken();
}